

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_add_quality(REF_HISTOGRAM ref_histogram,REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_STATUS RVar1;
  uint uVar2;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  int cell;
  REF_DBL quality;
  REF_INT nodes [27];
  
  if (ref_grid->twod == 0) {
    lVar3 = 0x28;
    if (ref_grid->surf == 0) {
      lVar3 = 0x50;
    }
  }
  else {
    lVar3 = 0x28;
  }
  ref_cell = *(REF_CELL *)((long)ref_grid->cell + lVar3 + -0x10);
  cell = 0;
  do {
    if (ref_cell->max <= cell) {
      uVar2 = ref_histogram_gather(ref_histogram,ref_grid->mpi);
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        pcVar5 = "gather";
        uVar4 = 0x1c4;
LAB_0014920d:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c"
               ,uVar4,"ref_histogram_add_quality",(ulong)uVar2,pcVar5);
      }
      return uVar2;
    }
    RVar1 = ref_cell_nodes(ref_cell,cell,nodes);
    if ((RVar1 == 0) && (ref_node = ref_grid->node, ref_node->part[nodes[0]] == ref_grid->mpi->id))
    {
      if ((ref_grid->twod == 0) && (ref_grid->surf == 0)) {
        uVar2 = ref_node_tet_quality(ref_node,nodes,&quality);
        if (uVar2 != 0) {
          pcVar5 = "qual";
          uVar4 = 0x1be;
          goto LAB_0014920d;
        }
      }
      else {
        uVar2 = ref_node_tri_quality(ref_node,nodes,&quality);
        if (uVar2 != 0) {
          pcVar5 = "qual";
          uVar4 = 0x1bb;
          goto LAB_0014920d;
        }
      }
      if (0.0 < quality) {
        uVar2 = ref_histogram_add(ref_histogram,quality);
        if (uVar2 != 0) {
          pcVar5 = "add";
          uVar4 = 0x1c0;
          goto LAB_0014920d;
        }
      }
    }
    cell = cell + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_histogram_add_quality(REF_HISTOGRAM ref_histogram,
                                             REF_GRID ref_grid) {
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality;

  if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_node_part(ref_grid_node(ref_grid), nodes[0]) ==
        ref_mpi_rank(ref_grid_mpi(ref_grid))) {
      if (ref_grid_twod(ref_grid) || ref_grid_surf(ref_grid)) {
        RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
            "qual");
      } else {
        RSS(ref_node_tet_quality(ref_grid_node(ref_grid), nodes, &quality),
            "qual");
      }
      if (quality > 0.0) RSS(ref_histogram_add(ref_histogram, quality), "add");
    }
  }

  RSS(ref_histogram_gather(ref_histogram, ref_grid_mpi(ref_grid)), "gather");

  return REF_SUCCESS;
}